

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::findStabilizationSample
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  pointer puVar1;
  pointer puVar2;
  qpTestLog *pqVar3;
  char *pcVar4;
  pointer pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  pointer pSVar10;
  pointer *ppuVar11;
  ulong uVar12;
  unsigned_long *puVar13;
  size_t sVar14;
  ulong uVar15;
  int iVar16;
  pointer pvVar17;
  int iVar18;
  long lVar19;
  TestLog *pTVar20;
  ulong uVar21;
  TestLog *pTVar23;
  int iVar24;
  ostringstream *poVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  sampleObservations;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allSamples;
  int local_228;
  allocator_type local_219;
  undefined1 local_218 [16];
  UploadWaitDrawCase *local_200;
  char *local_1f8;
  long local_1f0;
  int local_1e4;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1e0;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b0 [16];
  pointer local_1a0;
  ios_base local_138 [264];
  ulong uVar22;
  
  local_1f8 = description;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_1e0,(long)(this->m_numMaxSwaps + 1),(allocator_type *)local_1b0);
  iVar18 = this->m_numMaxSwaps;
  local_200 = this;
  if (-1 < this->m_numMaxSwaps) {
    iVar16 = 0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (local_1e0.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar16,
                 (long)local_200->m_numSamplesPerSwap);
      pSVar10 = (local_200->m_samples).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar26 = (uint)((ulong)((long)(local_200->m_samples).
                                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10) >> 4
                     );
      if (0 < (int)uVar26) {
        puVar13 = (unsigned_long *)
                  ((long)&((local_200->m_results).
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                           ._M_impl.super__Vector_impl_data._M_start)->uploadDuration + target);
        uVar12 = (ulong)(uVar26 & 0x7fffffff);
        iVar18 = 0;
        do {
          if (pSVar10->numFrames == iVar16) {
            lVar19 = (long)iVar18;
            iVar18 = iVar18 + 1;
            local_1e0.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar16].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar19] = *puVar13;
          }
          pSVar10 = pSVar10 + 1;
          puVar13 = puVar13 + 5;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      puVar1 = local_1e0.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar16].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = local_1e0.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar16].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar1 != puVar2) {
        uVar12 = (long)puVar2 - (long)puVar1 >> 3;
        lVar19 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar1,puVar2,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar1,puVar2);
      }
      iVar16 = iVar16 + 1;
      this = local_200;
      iVar18 = local_200->m_numMaxSwaps;
    } while (iVar16 <= local_200->m_numMaxSwaps);
  }
  do {
    iVar16 = iVar18;
    iVar18 = iVar16 + -1;
    if (iVar16 == 0) break;
    iVar8 = iVar18;
    do {
      pvVar5 = local_1e0.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar8 = iVar8 + 1;
      local_1e4 = this->m_numMaxSwaps;
      if (local_1e4 < iVar8) break;
      lVar19 = (long)iVar8;
      local_1f0 = lVar19 * 3;
      uVar15 = (long)local_1e0.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar18].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1e0.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar18].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar12 = uVar15 >> 3;
      local_218._0_8_ = uVar12;
      iVar24 = (int)((ulong)((long)local_1e0.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1e0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar9 = iVar24 + (int)uVar12;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,(long)iVar9,
                 &local_219);
      pvVar17 = pvVar5 + iVar18;
      puVar1 = (pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar14 = (long)(pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
      if (sVar14 != 0) {
        memmove((void *)local_1b0._0_8_,puVar1,sVar14);
      }
      ppuVar11 = &(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start + local_1f0;
      puVar1 = *ppuVar11;
      sVar14 = (long)ppuVar11[1] - (long)puVar1;
      if (sVar14 != 0) {
        memmove((void *)((long)(qpTestLog **)local_1b0._0_8_ + ((long)(uVar15 * 0x20000000) >> 0x1d)
                        ),puVar1,sVar14);
      }
      uVar7 = local_1b0._8_8_;
      uVar6 = local_1b0._0_8_;
      if (local_1b0._0_8_ != local_1b0._8_8_) {
        uVar12 = (long)(local_1b0._8_8_ - local_1b0._0_8_) >> 3;
        lVar19 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_1b0._0_8_,local_1b0._8_8_,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (uVar6,uVar7);
      }
      puVar1 = (pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar26 = (uint)((ulong)((long)(pvVar17->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3
                     );
      if ((int)uVar26 < 1) {
        local_1c8 = 0.0;
      }
      else {
        uVar12 = (long)(local_1b0._8_8_ - local_1b0._0_8_) >> 3;
        local_1c8 = 0.0;
        uVar15 = 0;
        do {
          pqVar3 = (qpTestLog *)puVar1[uVar15];
          pTVar20 = (TestLog *)local_1b0._0_8_;
          if (0 < (long)uVar12) {
            uVar22 = uVar12;
            do {
              uVar21 = uVar22 >> 1;
              fVar28 = (float)pTVar20[uVar21].m_log;
              fVar29 = fVar28 - (float)pqVar3;
              fVar27 = -fVar29;
              if (-fVar29 <= fVar29) {
                fVar27 = fVar29;
              }
              if ((((100.0 < fVar27) && (pTVar20[uVar21].m_log < pqVar3)) &&
                  (fVar28 * 0.15 < fVar27)) && ((float)pqVar3 * 0.15 < fVar27)) {
                pTVar20 = pTVar20 + uVar21 + 1;
                uVar21 = ~uVar21 + uVar22;
              }
              uVar22 = uVar21;
            } while (0 < (long)uVar21);
          }
          pTVar23 = (TestLog *)local_1b0._0_8_;
          if (0 < (long)uVar12) {
            uVar22 = uVar12;
            do {
              uVar21 = uVar22 >> 1;
              fVar28 = (float)pTVar23[uVar21].m_log;
              fVar29 = (float)pqVar3 - fVar28;
              fVar27 = -fVar29;
              if (-fVar29 <= fVar29) {
                fVar27 = fVar29;
              }
              if (((fVar27 <= 100.0) || (pTVar23[uVar21].m_log <= pqVar3)) ||
                 ((fVar27 <= (float)pqVar3 * 0.15 || (fVar27 <= fVar28 * 0.15)))) {
                pTVar23 = pTVar23 + uVar21 + 1;
                uVar21 = ~uVar21 + uVar22;
              }
              uVar22 = uVar21;
            } while (0 < (long)uVar21);
          }
          local_1c8 = local_1c8 +
                      (float)((int)((ulong)((long)pTVar20 - local_1b0._0_8_) >> 3) +
                              (int)((ulong)((long)pTVar23 - local_1b0._0_8_) >> 3) + 1) * 0.5;
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uVar26 & 0x7fffffff));
      }
      iVar24 = iVar24 * local_218._0_4_;
      fVar27 = (float)((iVar9 + 1) * iVar24) / 12.0;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)0x0) {
        operator_delete((void *)local_1b0._0_8_,(long)local_1a0 - local_1b0._0_8_);
      }
      this = local_200;
      fVar29 = (float)(((local_218._0_4_ + 1) * local_218._0_4_) / 2 + iVar24) - local_1c8;
      fVar28 = (float)iVar24 - fVar29;
      uVar26 = -(uint)(fVar29 <= fVar28);
      fVar27 = ((float)iVar24 * -0.5 + (float)(~uVar26 & (uint)fVar28 | (uint)fVar29 & uVar26)) /
               fVar27;
      local_218 = ZEXT416((uint)fVar27);
      fVar28 = -fVar27;
      if (-fVar27 <= fVar27) {
        fVar28 = fVar27;
      }
      poVar25 = (ostringstream *)(local_1b0 + 8);
      if (1.96 < fVar28) {
        uStack_1c4 = 0x80000000;
        uStack_1c0 = 0x80000000;
        uStack_1bc = 0x80000000;
        local_1c8 = fVar28;
        if (iVar16 == local_200->m_numMaxSwaps) {
          local_1b0._0_8_ =
               ((local_200->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar25);
          pcVar4 = local_1f8;
          if (local_1f8 == (char *)0x0) {
            std::ios::clear((int)poVar25 + (int)((TestLog *)(local_1b0._8_8_ + -0x18))->m_log);
          }
          else {
            sVar14 = strlen(local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,pcVar4,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,": Samples with swap count ",0x1a);
          std::ostream::operator<<(poVar25,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," and ",5);
          std::ostream::operator<<(poVar25,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25," do not seem to have the same distribution:\n",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,"\tDifference in standard deviations: ",0x24);
          std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\tSwap count ",0xc)
          ;
          std::ostream::operator<<(poVar25,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," median: ",9);
          puVar1 = local_1e0.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar18].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar27 = (float)(((long)local_1e0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar18].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) - 1
                          ) * 0.5;
          local_218._0_4_ = fVar27;
          fVar27 = floorf(fVar27);
          std::ostream::_M_insert<double>
                    ((double)(((float)local_218._0_4_ - (float)(int)fVar27) *
                              (float)puVar1[(int)fVar27 + 1] +
                             (float)puVar1[(int)fVar27] *
                             (1.0 - ((float)local_218._0_4_ - (float)(int)fVar27))));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\tSwap count ",0xc)
          ;
          std::ostream::operator<<(poVar25,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," median: ",9);
          puVar1 = (&((local_1e0.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start)[local_1f0];
          local_218._0_4_ =
               (float)(((long)(&((local_1e0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish)[local_1f0] - (long)puVar1
                       >> 3) - 1) * 0.5;
          fVar27 = floorf((float)local_218._0_4_);
          std::ostream::_M_insert<double>
                    ((double)(((float)local_218._0_4_ - (float)(int)fVar27) *
                              (float)puVar1[(int)fVar27 + 1] +
                             (float)puVar1[(int)fVar27] *
                             (1.0 - ((float)local_218._0_4_ - (float)(int)fVar27))));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar25);
          std::ios_base::~ios_base(local_138);
          local_228 = -1;
          fVar28 = local_1c8;
        }
        else {
          local_1b0._0_8_ =
               ((local_200->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar25);
          pcVar4 = local_1f8;
          if (local_1f8 == (char *)0x0) {
            std::ios::clear((int)poVar25 + (int)((TestLog *)(local_1b0._8_8_ + -0x18))->m_log);
          }
          else {
            sVar14 = strlen(local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,pcVar4,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,": Samples with swap count ",0x1a);
          std::ostream::operator<<(poVar25,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," and ",5);
          std::ostream::operator<<(poVar25,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25," do not seem to have the same distribution:\n",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,"\tSamples with swap count ",0x19);
          std::ostream::operator<<(poVar25,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25," are not part of the tail of stable results.\n",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,"\tDifference in standard deviations: ",0x24);
          std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\tSwap count ",0xc)
          ;
          std::ostream::operator<<(poVar25,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," median: ",9);
          puVar1 = local_1e0.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar18].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar27 = (float)(((long)local_1e0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar18].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) - 1
                          ) * 0.5;
          local_218._0_4_ = fVar27;
          fVar27 = floorf(fVar27);
          std::ostream::_M_insert<double>
                    ((double)(((float)local_218._0_4_ - (float)(int)fVar27) *
                              (float)puVar1[(int)fVar27 + 1] +
                             (float)puVar1[(int)fVar27] *
                             (1.0 - ((float)local_218._0_4_ - (float)(int)fVar27))));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\tSwap count ",0xc)
          ;
          std::ostream::operator<<(poVar25,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," median: ",9);
          puVar1 = (&((local_1e0.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start)[local_1f0];
          local_218._0_4_ =
               (float)(((long)(&((local_1e0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish)[local_1f0] - (long)puVar1
                       >> 3) - 1) * 0.5;
          fVar27 = floorf((float)local_218._0_4_);
          std::ostream::_M_insert<double>
                    ((double)(((float)local_218._0_4_ - (float)(int)fVar27) *
                              (float)puVar1[(int)fVar27 + 1] +
                             (float)puVar1[(int)fVar27] *
                             (1.0 - ((float)local_218._0_4_ - (float)(int)fVar27))));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar25);
          std::ios_base::~ios_base(local_138);
          fVar28 = local_1c8;
          local_228 = iVar16;
        }
      }
    } while (fVar28 <= 1.96);
  } while (local_1e4 < iVar8);
  poVar25 = (ostringstream *)(local_1b0 + 8);
  if (iVar16 == 0) {
    local_1b0._0_8_ =
         ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar25);
    pcVar4 = local_1f8;
    if (local_1f8 == (char *)0x0) {
      std::ios::clear((int)poVar25 + (int)((TestLog *)(local_1b0._8_8_ + -0x18))->m_log);
    }
    else {
      sVar14 = strlen(local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,pcVar4,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25,": All samples seem to have the same distribution",0x30);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar25);
    std::ios_base::~ios_base(local_138);
    local_228 = 0;
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_1e0);
  return local_228;
}

Assistant:

int UploadWaitDrawCase::findStabilizationSample (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	std::vector<std::vector<deUint64> >	sampleObservations(m_numMaxSwaps+1);
	ThresholdComparer<deUint64>			comparer;

	comparer.relativeThreshold = 0.15f;	// 15%
	comparer.absoluteThreshold = 100;	// (us), assumed sampling precision

	// get observations and order them

	for (int swapNdx = 0; swapNdx <= m_numMaxSwaps; ++swapNdx)
	{
		int insertNdx = 0;

		sampleObservations[swapNdx].resize(m_numSamplesPerSwap);

		for (int ndx = 0; ndx < (int)m_samples.size(); ++ndx)
			if (m_samples[ndx].numFrames == swapNdx)
				sampleObservations[swapNdx][insertNdx++] = m_results[ndx].*target;

		DE_ASSERT(insertNdx == m_numSamplesPerSwap);

		std::sort(sampleObservations[swapNdx].begin(), sampleObservations[swapNdx].end());
	}

	// find stabilization point

	for (int sampleNdx = m_numMaxSwaps-1; sampleNdx != -1; --sampleNdx )
	{
		// Distribution is equal to all following distributions
		for (int cmpTargetDistribution = sampleNdx+1; cmpTargetDistribution <= m_numMaxSwaps; ++cmpTargetDistribution)
		{
			// Stable section ends here?
			const DistributionCompareResult result = distributionCompare(sampleObservations[sampleNdx], sampleObservations[cmpTargetDistribution], comparer);
			if (!result.equal)
			{
				// Last two samples are not equal? Samples never stabilized
				if (sampleNdx == m_numMaxSwaps-1)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;
					return -1;
				}
				else
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tSamples with swap count " << sampleNdx << " are not part of the tail of stable results.\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;

					return sampleNdx+1;
				}
			}
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< description << ": All samples seem to have the same distribution"
		<< tcu::TestLog::EndMessage;

	// all distributions equal
	return 0;
}